

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int parse_http_request(char *buf,int len,mg_request_info *ri)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  bool bVar4;
  int local_30;
  int init_skip;
  int request_length;
  mg_request_info *ri_local;
  byte *pbStack_18;
  int len_local;
  char *buf_local;
  
  local_30 = 0;
  ri->http_version = (char *)0x0;
  ri->request_uri = (char *)0x0;
  ri->request_method = (char *)0x0;
  ri->remote_user = (char *)0x0;
  ri->num_headers = 0;
  ri_local._4_4_ = len;
  pbStack_18 = (byte *)buf;
  while( true ) {
    bVar4 = false;
    if (0 < ri_local._4_4_) {
      ppuVar3 = __ctype_b_loc();
      bVar4 = ((*ppuVar3)[(int)(uint)*pbStack_18] & 0x2000) != 0;
    }
    if (!bVar4) break;
    pbStack_18 = pbStack_18 + 1;
    ri_local._4_4_ = ri_local._4_4_ + -1;
    local_30 = local_30 + 1;
  }
  if (ri_local._4_4_ == 0) {
    buf_local._4_4_ = 0;
  }
  else {
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)(uint)*pbStack_18] & 2) == 0) {
      iVar1 = get_http_header_len((char *)pbStack_18,ri_local._4_4_);
      buf_local._4_4_ = iVar1;
      if (0 < iVar1) {
        pbStack_18[iVar1 + -1] = 0;
        if (((*pbStack_18 == 0) || (*pbStack_18 == 0xd)) || (*pbStack_18 == 10)) {
          buf_local._4_4_ = -1;
        }
        else {
          ri->request_method = (char *)pbStack_18;
          iVar2 = skip_to_end_of_word_and_terminate((char **)&stack0xffffffffffffffe8,0);
          if (iVar2 < 1) {
            buf_local._4_4_ = -1;
          }
          else {
            ri->request_uri = (char *)pbStack_18;
            iVar2 = skip_to_end_of_word_and_terminate((char **)&stack0xffffffffffffffe8,0);
            if (iVar2 < 1) {
              buf_local._4_4_ = -1;
            }
            else {
              ri->http_version = (char *)pbStack_18;
              iVar2 = skip_to_end_of_word_and_terminate((char **)&stack0xffffffffffffffe8,1);
              if (iVar2 < 1) {
                buf_local._4_4_ = -1;
              }
              else {
                iVar2 = strncmp(ri->http_version,"HTTP/",5);
                if (iVar2 == 0) {
                  ri->http_version = ri->http_version + 5;
                  iVar2 = is_valid_http_method(ri->request_method);
                  if (iVar2 == 0) {
                    buf_local._4_4_ = -1;
                  }
                  else {
                    iVar2 = parse_http_headers((char **)&stack0xffffffffffffffe8,ri->http_headers);
                    ri->num_headers = iVar2;
                    if (ri->num_headers < 0) {
                      buf_local._4_4_ = -1;
                    }
                    else {
                      buf_local._4_4_ = iVar1 + local_30;
                    }
                  }
                }
                else {
                  buf_local._4_4_ = -1;
                }
              }
            }
          }
        }
      }
    }
    else {
      buf_local._4_4_ = -1;
    }
  }
  return buf_local._4_4_;
}

Assistant:

static int
parse_http_request(char *buf, int len, struct mg_request_info *ri)
{
	int request_length;
	int init_skip = 0;

	/* Reset attributes. DO NOT TOUCH is_ssl, remote_addr,
	 * remote_port */
	ri->remote_user = ri->request_method = ri->request_uri = ri->http_version =
	    NULL;
	ri->num_headers = 0;

	/* RFC says that all initial whitespaces should be ignored */
	/* This included all leading \r and \n (isspace) */
	/* See table: http://www.cplusplus.com/reference/cctype/ */
	while ((len > 0) && isspace((unsigned char)*buf)) {
		buf++;
		len--;
		init_skip++;
	}

	if (len == 0) {
		/* Incomplete request */
		return 0;
	}

	/* Control characters are not allowed, including zero */
	if (iscntrl((unsigned char)*buf)) {
		return -1;
	}

	/* Find end of HTTP header */
	request_length = get_http_header_len(buf, len);
	if (request_length <= 0) {
		return request_length;
	}
	buf[request_length - 1] = '\0';

	if ((*buf == 0) || (*buf == '\r') || (*buf == '\n')) {
		return -1;
	}

	/* The first word has to be the HTTP method */
	ri->request_method = buf;

	if (skip_to_end_of_word_and_terminate(&buf, 0) <= 0) {
		return -1;
	}

	/* The second word is the URI */
	ri->request_uri = buf;

	if (skip_to_end_of_word_and_terminate(&buf, 0) <= 0) {
		return -1;
	}

	/* Next would be the HTTP version */
	ri->http_version = buf;

	if (skip_to_end_of_word_and_terminate(&buf, 1) <= 0) {
		return -1;
	}

	/* Check for a valid HTTP version key */
	if (strncmp(ri->http_version, "HTTP/", 5) != 0) {
		/* Invalid request */
		return -1;
	}
	ri->http_version += 5;

	/* Check for a valid http method */
	if (!is_valid_http_method(ri->request_method)) {
		return -1;
	}

	/* Parse all HTTP headers */
	ri->num_headers = parse_http_headers(&buf, ri->http_headers);
	if (ri->num_headers < 0) {
		/* Error while parsing headers */
		return -1;
	}

	return request_length + init_skip;
}